

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali_variant.h
# Opt level: O2

void cali::Variant::update_minmaxsum
               (Variant *val,Variant *min_val,Variant *max_val,Variant *sum_val)

{
  anon_union_8_7_33918203_for_value *paVar1;
  double dVar2;
  char cVar3;
  anon_union_8_7_33918203_for_value aVar4;
  void *pvVar5;
  
  if ((min_val->m_v).type_and_size == 0) {
    aVar4 = (val->m_v).value;
    (min_val->m_v).type_and_size = (val->m_v).type_and_size;
    (min_val->m_v).value = aVar4;
    aVar4 = (val->m_v).value;
    (max_val->m_v).type_and_size = (val->m_v).type_and_size;
    (max_val->m_v).value = aVar4;
    aVar4 = (val->m_v).value;
    (sum_val->m_v).type_and_size = (val->m_v).type_and_size;
    (sum_val->m_v).value = aVar4;
    return;
  }
  cVar3 = (char)(val->m_v).type_and_size;
  if (cVar3 == '\x02') {
    pvVar5 = (void *)(val->m_v).value.v_int;
    paVar1 = &(sum_val->m_v).value;
    paVar1->unmanaged_ptr = (void *)((long)paVar1->unmanaged_ptr + (long)pvVar5);
    if ((long)pvVar5 < (min_val->m_v).value.v_int) {
LAB_001bf958:
      (min_val->m_v).value.unmanaged_ptr = pvVar5;
      return;
    }
    if ((max_val->m_v).value.v_int < (long)pvVar5) {
LAB_001bf963:
      (max_val->m_v).value.unmanaged_ptr = pvVar5;
      return;
    }
  }
  else if (cVar3 == '\x03') {
    pvVar5 = (val->m_v).value.unmanaged_ptr;
    paVar1 = &(sum_val->m_v).value;
    paVar1->unmanaged_ptr = (void *)((long)paVar1->unmanaged_ptr + (long)pvVar5);
    if (pvVar5 < (void *)(min_val->m_v).value.v_uint) goto LAB_001bf958;
    if ((void *)(max_val->m_v).value.v_uint < pvVar5) goto LAB_001bf963;
  }
  else if (cVar3 == '\x06') {
    dVar2 = (val->m_v).value.v_double;
    (sum_val->m_v).value.v_double = (sum_val->m_v).value.v_double + dVar2;
    if (dVar2 < (min_val->m_v).value.v_double) {
      (min_val->m_v).value.v_double = dVar2;
      return;
    }
    paVar1 = &(max_val->m_v).value;
    if (paVar1->v_double <= dVar2 && dVar2 != paVar1->v_double) {
      (max_val->m_v).value.v_double = dVar2;
      return;
    }
  }
  return;
}

Assistant:

inline bool cali_variant_is_empty(cali_variant_t v)
{
    return 0 == v.type_and_size;
}